

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall
tetgenmesh::projpt2edge(tetgenmesh *this,double *p,double *e1,double *e2,double *prj)

{
  double dVar1;
  double l_p;
  double len;
  double v2 [3];
  double local_48;
  double v1 [3];
  double *prj_local;
  double *e2_local;
  double *e1_local;
  double *p_local;
  tetgenmesh *this_local;
  
  local_48 = *e2 - *e1;
  v1[0] = e2[1] - e1[1];
  v1[1] = e2[2] - e1[2];
  len = *p - *e1;
  v2[0] = p[1] - e1[1];
  v2[1] = p[2] - e1[2];
  v1[2] = (double)prj;
  dVar1 = dot(this,&local_48,&local_48);
  dVar1 = sqrt(dVar1);
  local_48 = local_48 / dVar1;
  v1[0] = v1[0] / dVar1;
  v1[1] = v1[1] / dVar1;
  dVar1 = dot(this,&local_48,&len);
  *(double *)v1[2] = dVar1 * local_48 + *e1;
  *(double *)((long)v1[2] + 8) = dVar1 * v1[0] + e1[1];
  *(double *)((long)v1[2] + 0x10) = dVar1 * v1[1] + e1[2];
  return;
}

Assistant:

void tetgenmesh::projpt2edge(REAL* p, REAL* e1, REAL* e2, REAL* prj)
{
  REAL v1[3], v2[3];
  REAL len, l_p;

  v1[0] = e2[0] - e1[0];
  v1[1] = e2[1] - e1[1];
  v1[2] = e2[2] - e1[2];
  v2[0] = p[0] - e1[0];
  v2[1] = p[1] - e1[1];
  v2[2] = p[2] - e1[2];

  len = sqrt(dot(v1, v1));
  v1[0] /= len;
  v1[1] /= len;
  v1[2] /= len;
  l_p = dot(v1, v2);

  prj[0] = e1[0] + l_p * v1[0];
  prj[1] = e1[1] + l_p * v1[1];
  prj[2] = e1[2] + l_p * v1[2];
}